

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

void UpdateCameraPro(Camera *camera,Vector3 movement,Vector3 rotation,float zoom)

{
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_28;
  
  CameraPitch(camera,rotation.y * -0.017453292,true,false,false);
  local_28 = rotation.x;
  CameraYaw(camera,local_28 * -0.017453292,false);
  CameraRoll(camera,rotation.z * 0.017453292);
  local_38 = movement.x;
  CameraMoveForward(camera,local_38,true);
  uStack_34 = movement.y;
  CameraMoveRight(camera,uStack_34,true);
  CameraMoveUp(camera,movement.z);
  CameraMoveToTarget(camera,zoom);
  return;
}

Assistant:

void UpdateCameraPro(Camera *camera, Vector3 movement, Vector3 rotation, float zoom)
{
    // Required values
    // movement.x - Move forward/backward
    // movement.y - Move right/left
    // movement.z - Move up/down
    // rotation.x - yaw
    // rotation.y - pitch
    // rotation.z - roll
    // zoom - Move towards target

    bool lockView = true;
    bool rotateAroundTarget = false;
    bool rotateUp = false;
    bool moveInWorldPlane = true;

    // Camera rotation
    CameraPitch(camera, -rotation.y*DEG2RAD, lockView, rotateAroundTarget, rotateUp);
    CameraYaw(camera, -rotation.x*DEG2RAD, rotateAroundTarget);
    CameraRoll(camera, rotation.z*DEG2RAD);

    // Camera movement
    CameraMoveForward(camera, movement.x, moveInWorldPlane);
    CameraMoveRight(camera, movement.y, moveInWorldPlane);
    CameraMoveUp(camera, movement.z);

    // Zoom target distance
    CameraMoveToTarget(camera, zoom);
}